

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O0

int64_t __thiscall
aeron::DriverProxy::removeDestination
          (DriverProxy *this,int64_t publicationRegistrationId,string *channel)

{
  int64_t iVar1;
  undefined8 *in_RDI;
  int64_t correlationId;
  anon_class_32_4_88066e9b *in_stack_000002a8;
  DriverProxy *in_stack_000002b0;
  
  iVar1 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    ((ManyToOneRingBuffer *)*in_RDI);
  writeCommandToDriver<aeron::DriverProxy::removeDestination(long,std::__cxx11::string_const&)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (in_stack_000002b0,in_stack_000002a8);
  return iVar1;
}

Assistant:

std::int64_t removeDestination(std::int64_t publicationRegistrationId, const std::string& channel)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            DestinationMessageFlyweight removeMessage(buffer, 0);

            removeMessage.clientId(m_clientId);
            removeMessage.registrationId(publicationRegistrationId);
            removeMessage.correlationId(correlationId);
            removeMessage.channel(channel);

            length = removeMessage.length();

            return ControlProtocolEvents::REMOVE_DESTINATION;
        });

        return correlationId;
    }